

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

PolyKernel * __thiscall CoreML::Specification::PolyKernel::New(PolyKernel *this,Arena *arena)

{
  PolyKernel *this_00;
  
  this_00 = (PolyKernel *)operator_new(0x28);
  PolyKernel(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::PolyKernel>(arena,this_00);
  }
  return this_00;
}

Assistant:

PolyKernel* PolyKernel::New(::google::protobuf::Arena* arena) const {
  PolyKernel* n = new PolyKernel;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}